

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O0

void __thiscall
crypto::iterated_hash<crypto::md5_transform>::pad
          (iterated_hash<crypto::md5_transform> *this,size_t last_block_size,char pad_first)

{
  unsigned_long uVar1;
  undefined1 in_DL;
  ulong in_RSI;
  void *in_RDI;
  size_t in_stack_00000010;
  size_t num;
  undefined7 in_stack_00000020;
  unsigned_long local_28;
  ulong local_20;
  undefined1 local_11;
  ulong local_10;
  
  local_28 = 0x40;
  local_11 = in_DL;
  local_10 = in_RSI;
  uVar1 = util::mod_power_of_2<unsigned_int,unsigned_long>((uint *)((long)in_RDI + 0x50),&local_28);
  local_20 = uVar1 + 1;
  *(undefined1 *)((long)in_RDI + uVar1) = local_11;
  if (local_10 < local_20) {
    memset((void *)((long)in_RDI + local_20),0,0x40 - local_20);
    hash((hash_word *)CONCAT17(pad_first,in_stack_00000020),(char *)num,in_stack_00000010);
    memset(in_RDI,0,local_10);
  }
  else {
    memset((void *)((long)in_RDI + local_20),0,local_10 - local_20);
  }
  return;
}

Assistant:

void iterated_hash<T>::pad(size_t last_block_size, char pad_first) {
	
	size_t num = util::mod_power_of_2(count_lo, size_t(block_size));
	
	buffer[num++] = pad_first;
	
	if(num <= last_block_size) {
		memset(buffer + num, 0, last_block_size - num);
	} else {
		memset(buffer + num, 0, block_size - num);
		hash(state, buffer, block_size);
		memset(buffer, 0, last_block_size);
	}
}